

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::GetImageTest::iterate(GetImageTest *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ContextType ctxType;
  ApiType requiredApiType;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ContextInfo *this_00;
  TestContext *pTVar7;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  Enum<int,_2UL> EVar10;
  undefined8 in_stack_fffffffffffff770;
  undefined4 uVar11;
  string local_768;
  string local_748;
  MessageBuilder local_728;
  uint local_5a4;
  GetNameFunc p_Stack_5a0;
  GLuint i_1;
  int local_598;
  Enum<int,_2UL> local_590;
  MessageBuilder local_580;
  int local_3fc;
  undefined1 local_3f8 [4];
  GLenum error_1;
  string local_3d8;
  MessageBuilder local_3b8;
  uint local_234;
  GetNameFunc p_Stack_230;
  GLuint i;
  int local_228;
  Enum<int,_2UL> local_220;
  MessageBuilder local_210;
  int local_90;
  GLenum error;
  GLubyte local_80 [8];
  GLubyte result_compressed [8];
  GLubyte result [64];
  GLuint texture;
  bool is_error;
  bool is_ok;
  bool is_arb_direct_state_access;
  bool is_at_least_gl_45;
  Functions *gl;
  GetImageTest *this_local;
  long lVar6;
  
  uVar11 = (undefined4)((ulong)in_stack_fffffffffffff770 >> 0x20);
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,5);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if ((bVar1) || (bVar2)) {
    bVar1 = true;
    result[0x3c] = '\0';
    result[0x3d] = '\0';
    result[0x3e] = '\0';
    result[0x3f] = '\0';
    result[0x28] = '\0';
    result[0x29] = '\0';
    result[0x2a] = '\0';
    result[0x2b] = '\0';
    result[0x2c] = '\0';
    result[0x2d] = '\0';
    result[0x2e] = '\0';
    result[0x2f] = '\0';
    result[0x30] = '\0';
    result[0x31] = '\0';
    result[0x32] = '\0';
    result[0x33] = '\0';
    result[0x34] = '\0';
    result[0x35] = '\0';
    result[0x36] = '\0';
    result[0x37] = '\0';
    result[0x18] = '\0';
    result[0x19] = '\0';
    result[0x1a] = '\0';
    result[0x1b] = '\0';
    result[0x1c] = '\0';
    result[0x1d] = '\0';
    result[0x1e] = '\0';
    result[0x1f] = '\0';
    result[0x20] = '\0';
    result[0x21] = '\0';
    result[0x22] = '\0';
    result[0x23] = '\0';
    result[0x24] = '\0';
    result[0x25] = '\0';
    result[0x26] = '\0';
    result[0x27] = '\0';
    result[8] = '\0';
    result[9] = '\0';
    result[10] = '\0';
    result[0xb] = '\0';
    result[0xc] = '\0';
    result[0xd] = '\0';
    result[0xe] = '\0';
    result[0xf] = '\0';
    result[0x10] = '\0';
    result[0x11] = '\0';
    result[0x12] = '\0';
    result[0x13] = '\0';
    result[0x14] = '\0';
    result[0x15] = '\0';
    result[0x16] = '\0';
    result[0x17] = '\0';
    result_compressed[0] = '\0';
    result_compressed[1] = '\0';
    result_compressed[2] = '\0';
    result_compressed[3] = '\0';
    result_compressed[4] = '\0';
    result_compressed[5] = '\0';
    result_compressed[6] = '\0';
    result_compressed[7] = '\0';
    result[0] = '\0';
    result[1] = '\0';
    result[2] = '\0';
    result[3] = '\0';
    result[4] = '\0';
    result[5] = '\0';
    result[6] = '\0';
    result[7] = '\0';
    local_80[0] = '\0';
    local_80[1] = '\0';
    local_80[2] = '\0';
    local_80[3] = '\0';
    local_80[4] = '\0';
    local_80[5] = '\0';
    local_80[6] = '\0';
    local_80[7] = '\0';
    (**(code **)(lVar6 + 0x6f8))(1,result + 0x3c);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1d28);
    (**(code **)(lVar6 + 0xb8))(0xde1,result._60_4_);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glBindTexture has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1d2b);
    (**(code **)(lVar6 + 0x1310))
              (0xde1,0,0x8058,4,4,0,0x1908,CONCAT44(uVar11,0x1401),s_texture_data);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glTexImage2D has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1d2f);
    (**(code **)(lVar6 + 0xad8))(result._60_4_,0,0x1908,0x1401,0x40,result_compressed);
    local_90 = 0;
    local_90 = (**(code **)(lVar6 + 0x800))();
    if (local_90 == 0) {
      for (local_234 = 0; local_234 < 0x40; local_234 = local_234 + 1) {
        if (s_texture_data[local_234] != result_compressed[local_234]) {
          pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
          pTVar8 = tcu::TestContext::getLog(pTVar7);
          tcu::TestLog::operator<<(&local_3b8,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (&local_3b8,(char (*) [26])"GetTextureImage returned ");
          DataToString_abi_cxx11_(&local_3d8,this,0x40,result_compressed);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_3d8);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [7])0x2a796ef);
          DataToString_abi_cxx11_((string *)local_3f8,this,0x40,s_texture_data);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (pMVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_3f8);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [27])0x2a84efa);
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)local_3f8);
          std::__cxx11::string::~string((string *)&local_3d8);
          tcu::MessageBuilder::~MessageBuilder(&local_3b8);
          bVar1 = false;
          break;
        }
      }
    }
    else {
      pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar8 = tcu::TestContext::getLog(pTVar7);
      tcu::TestLog::operator<<(&local_210,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (&local_210,(char (*) [46])"GetTextureImage unexpectedly generated error ")
      ;
      EVar10 = glu::getErrorStr(local_90);
      p_Stack_230 = EVar10.m_getName;
      local_228 = EVar10.m_value;
      local_220.m_getName = p_Stack_230;
      local_220.m_value = local_228;
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_220);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [14])0x2a850ac);
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_210);
      bVar1 = false;
    }
    (**(code **)(lVar6 + 0x480))(1,result + 0x3c);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1d55);
    result[0x3c] = '\0';
    result[0x3d] = '\0';
    result[0x3e] = '\0';
    result[0x3f] = '\0';
    (**(code **)(lVar6 + 0x6f8))(1,result + 0x3c);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1d5d);
    (**(code **)(lVar6 + 0xb8))(0xde1,result._60_4_);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glBindTexture has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1d60);
    (**(code **)(lVar6 + 0x288))(0xde1,0,0x9274,4,4,0,8,&s_texture_data_compressed);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glCompressedTexImage2D has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1d64);
    (**(code **)(lVar6 + 2000))(result._60_4_,0,8,local_80);
    local_3fc = 0;
    local_3fc = (**(code **)(lVar6 + 0x800))();
    if (local_3fc == 0) {
      for (local_5a4 = 0; local_5a4 < 8; local_5a4 = local_5a4 + 1) {
        if (*(GLubyte *)((long)&s_texture_data_compressed + (ulong)local_5a4) !=
            result_compressed[(ulong)local_5a4 - 8]) {
          pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
          pTVar8 = tcu::TestContext::getLog(pTVar7);
          tcu::TestLog::operator<<(&local_728,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (&local_728,(char (*) [36])"GetCompressedTextureImage returned ");
          DataToString_abi_cxx11_(&local_748,this,8,local_80);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_748);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [7])0x2a796ef);
          DataToString_abi_cxx11_(&local_768,this,8,(GLubyte *)&s_texture_data_compressed);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_768);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [27])0x2a84efa);
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_768);
          std::__cxx11::string::~string((string *)&local_748);
          tcu::MessageBuilder::~MessageBuilder(&local_728);
          bVar1 = false;
          break;
        }
      }
    }
    else {
      pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar8 = tcu::TestContext::getLog(pTVar7);
      tcu::TestLog::operator<<(&local_580,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (&local_580,
                          (char (*) [56])"GetCompressedTextureImage unexpectedly generated error ");
      EVar10 = glu::getErrorStr(local_3fc);
      p_Stack_5a0 = EVar10.m_getName;
      local_598 = EVar10.m_value;
      local_590.m_getName = p_Stack_5a0;
      local_590.m_value = local_598;
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_590);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [14])0x2a850ac);
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_580);
      bVar1 = false;
    }
    if (result._60_4_ != 0) {
      (**(code **)(lVar6 + 0x480))(1);
    }
    if (bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetImageTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Objects. */
	glw::GLuint  texture									   = 0;
	glw::GLubyte result[s_texture_count]					   = {};
	glw::GLubyte result_compressed[s_texture_count_compressed] = {};

	try
	{
		/* Uncompressed case. */
		{
			/* Texture initiation. */
			gl.genTextures(1, &texture);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

			gl.bindTexture(GL_TEXTURE_2D, texture);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

			gl.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, s_texture_width, s_texture_height, 0, GL_RGBA, GL_UNSIGNED_BYTE,
						  s_texture_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D has failed");

			/* Quering image with tested function. */
			gl.getTextureImage(texture, 0, GL_RGBA, GL_UNSIGNED_BYTE, sizeof(result), result);

			/* Check for errors. */
			glw::GLenum error = GL_NO_ERROR;

			if (GL_NO_ERROR != (error = gl.getError()))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "GetTextureImage unexpectedly generated error "
					<< glu::getErrorStr(error) << ". Test fails." << tcu::TestLog::EndMessage;

				is_ok = false;
			}
			else
			{
				/* No error, so compare images. */
				for (glw::GLuint i = 0; i < s_texture_count; ++i)
				{
					if (s_texture_data[i] != result[i])
					{
						m_context.getTestContext().getLog() << tcu::TestLog::Message << "GetTextureImage returned "
															<< DataToString(s_texture_count, result) << ", but "
															<< DataToString(s_texture_count, s_texture_data)
															<< " was expected. Test fails." << tcu::TestLog::EndMessage;

						is_ok = false;

						break;
					}
				}
			}
		}

		/* Clean up texture .*/
		gl.deleteTextures(1, &texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		texture = 0;

		/* Compressed case. */
		{
			/* Texture initiation. */
			gl.genTextures(1, &texture);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

			gl.bindTexture(GL_TEXTURE_2D, texture);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

			gl.compressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGB8_ETC2, s_texture_width, s_texture_height, 0,
									s_texture_size_compressed, s_texture_data_compressed);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompressedTexImage2D has failed");

			/* Quering image with tested function. */
			gl.getCompressedTextureImage(texture, 0, s_texture_count_compressed * sizeof(result_compressed[0]),
										 result_compressed);

			/* Check for errors. */
			glw::GLenum error = GL_NO_ERROR;

			if (GL_NO_ERROR != (error = gl.getError()))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "GetCompressedTextureImage unexpectedly generated error "
					<< glu::getErrorStr(error) << ". Test fails." << tcu::TestLog::EndMessage;

				is_ok = false;
			}
			else
			{
				/* No error, so compare images. */
				for (glw::GLuint i = 0; i < s_texture_count_compressed; ++i)
				{
					if (s_texture_data_compressed[i] != result_compressed[i])
					{
						m_context.getTestContext().getLog()
							<< tcu::TestLog::Message << "GetCompressedTextureImage returned "
							<< DataToString(s_texture_count_compressed, result_compressed) << ", but "
							<< DataToString(s_texture_count_compressed, s_texture_data_compressed)
							<< " was expected. Test fails." << tcu::TestLog::EndMessage;

						is_ok = false;

						break;
					}
				}
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (texture)
	{
		gl.deleteTextures(1, &texture);
	}

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}